

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

void Dar_LibPrepare(int nSubgraphs)

{
  Dar_Lib_t *p;
  long lVar1;
  long lVar2;
  int iVar3;
  
  p = s_DarLib;
  if (s_DarLib->nSubgraphs == nSubgraphs) {
    return;
  }
  s_DarLib->nSubgr0Total = 0;
  lVar1 = 0;
  do {
    if (lVar1 == 1) {
      iVar3 = p->nSubgr[1];
      p->nSubgr0[1] = iVar3;
    }
    else {
      if (lVar1 == 0xde) {
        for (lVar1 = 0xa7b; lVar1 != 0xb59; lVar1 = lVar1 + 1) {
          p->nSubgr[lVar1 + -4] = 0;
        }
        for (lVar1 = 0; lVar1 < p->iObj; lVar1 = lVar1 + 1) {
          p->pObjs[lVar1] = (Dar_LibObj_t)((ulong)p->pObjs[lVar1] & 0xfffffffff | 0xff000000000);
        }
        p->nNodes0Total = 0;
        p->nNodes0Max = 0;
        for (lVar1 = 0; lVar1 != 0xde; lVar1 = lVar1 + 1) {
          for (lVar2 = 0; lVar2 < p->nSubgr0[lVar1]; lVar2 = lVar2 + 1) {
            Dar_LibSetup0_rec(p,p->pObjs + p->pSubgr0[lVar1][lVar2],(int)lVar1,0);
          }
          p->nNodes0Total = p->nNodes0Total + p->nNodes0[lVar1];
          iVar3 = p->nNodes0[lVar1];
          if (p->nNodes0[lVar1] < p->nNodes0Max) {
            iVar3 = p->nNodes0Max;
          }
          p->nNodes0Max = iVar3;
        }
        for (lVar1 = 0xa7b; lVar1 != 0xb59; lVar1 = lVar1 + 1) {
          p->nSubgr[lVar1 + -4] = 0;
        }
        for (lVar1 = 0; lVar1 < p->iObj; lVar1 = lVar1 + 1) {
          p->pObjs[lVar1] = (Dar_LibObj_t)((ulong)p->pObjs[lVar1] & 0xfffffffff | 0xff000000000);
        }
        iVar3 = 0;
        for (lVar1 = 0; lVar1 != 0xde; lVar1 = lVar1 + 1) {
          for (lVar2 = 0; lVar2 < p->nSubgr0[lVar1]; lVar2 = lVar2 + 1) {
            Dar_LibSetup0_rec(p,p->pObjs + p->pSubgr0[lVar1][lVar2],(int)lVar1,1);
          }
          iVar3 = iVar3 + p->nNodes0[lVar1];
        }
        if (iVar3 == p->nNodes0Total) {
          lVar1 = 0;
          for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
            p->pObjs[lVar2] = (Dar_LibObj_t)(((ulong)p->pObjs[lVar2] & 0xfffffffff) + lVar1);
            lVar1 = lVar1 + 0x1000000000;
          }
          Dar_LibCreateData(p,p->nNodes0Max + 0x20);
          return;
        }
        __assert_fail("nNodes0Total == p->nNodes0Total",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                      ,0x21a,"void Dar_LibPrepare(int)");
      }
      iVar3 = p->nSubgr[lVar1];
      if (nSubgraphs <= p->nSubgr[lVar1]) {
        iVar3 = nSubgraphs;
      }
      p->nSubgr0[lVar1] = iVar3;
    }
    p->nSubgr0Total = p->nSubgr0Total + iVar3;
    for (lVar2 = 0; lVar2 < p->nSubgr0[lVar1]; lVar2 = lVar2 + 1) {
      p->pSubgr0[lVar1][lVar2] = p->pSubgr[lVar1][p->pPrios[lVar1][lVar2]];
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void Dar_LibPrepare( int nSubgraphs )
{
    Dar_Lib_t * p = s_DarLib;
    int i, k, nNodes0Total;
    if ( p->nSubgraphs == nSubgraphs )
        return;

    // favor special classes:
    //  1 : F = (!d*!c*!b*!a)
    //  4 : F = (!d*!c*!(b*a))
    // 12 : F = (!d*!(c*!(!b*!a)))
    // 20 : F = (!d*!(c*b*a))

    // set the subgraph counters 
    p->nSubgr0Total = 0;
    for ( i = 0; i < 222; i++ )
    {
//        if ( i == 1 || i == 4 || i == 12 || i == 20 ) // special classes 
        if ( i == 1 ) // special classes 
            p->nSubgr0[i] = p->nSubgr[i];
        else
            p->nSubgr0[i] = Abc_MinInt( p->nSubgr[i], nSubgraphs );
        p->nSubgr0Total += p->nSubgr0[i];
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            p->pSubgr0[i][k] = p->pSubgr[i][ p->pPrios[i][k] ];
    }

    // count the number of nodes
    // clean node counters
    for ( i = 0; i < 222; i++ )
        p->nNodes0[i] = 0;
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // count nodes in each class
    // count the total number of nodes and the largest class
    p->nNodes0Total = 0;
    p->nNodes0Max = 0;
    for ( i = 0; i < 222; i++ )
    {
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            Dar_LibSetup0_rec( p, Dar_LibObj(p, p->pSubgr0[i][k]), i, 0 );
        p->nNodes0Total += p->nNodes0[i];
        p->nNodes0Max = Abc_MaxInt( p->nNodes0Max, p->nNodes0[i] );
    }

    // clean node counters
    for ( i = 0; i < 222; i++ )
        p->nNodes0[i] = 0;
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // add the nodes to storage
    nNodes0Total = 0;
    for ( i = 0; i < 222; i++ )
    {
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            Dar_LibSetup0_rec( p, Dar_LibObj(p, p->pSubgr0[i][k]), i, 1 );
         nNodes0Total += p->nNodes0[i];
    }
    assert( nNodes0Total == p->nNodes0Total );
     // prepare the number of the PI nodes
    for ( i = 0; i < 4; i++ )
        Dar_LibObj(p, i)->Num = i;

    // realloc the datas
    Dar_LibCreateData( p, p->nNodes0Max + 32 ); 
    // allocated more because Dar_LibBuildBest() sometimes requires more entries
}